

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>::
runOnFunction(WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>
              *this,Module *module,Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::walkFunctionInModule
              (&(this->
                super_PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>).
                super_Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>,func,
               module);
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::LogExecution>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<wasm::LogExecution>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }